

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdySparseMAPSolver.cpp
# Opt level: O1

void __thiscall
iDynTree::BerdySparseMAPSolver::BerdySparseMAPSolverPimpl::computeMAP
          (BerdySparseMAPSolverPimpl *this,bool computePermutation)

{
  SparseMatrix<double,_0,_int> *a;
  BerdySparseMAPSolverPimpl *pBVar1;
  plain_array<int,_2,_0,_0> a_00;
  undefined4 uVar2;
  uint uVar3;
  ulong uVar4;
  pointer pbVar5;
  pointer pcVar6;
  ScalarPointer pdVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_> PVar11;
  IndexPointer piVar12;
  ScalarPointer pdVar13;
  Index IVar14;
  undefined8 uVar15;
  LhsNested pSVar16;
  undefined7 in_register_00000031;
  assign_op<double,_double> local_1f9;
  BerdySparseMAPSolverPimpl *local_1f8;
  plain_array<int,_2,_0,_0> local_1f0;
  size_type local_1e8;
  plain_array<int,_2,_0,_0> local_1e0;
  plain_array<int,_2,_0,_0> local_1d8;
  plain_array<int,_2,_0,_0> local_1d0;
  plain_array<int,_2,_0,_0> local_1c8;
  LhsNested local_1c0;
  plain_array<int,_2,_0,_0> local_1b8;
  plain_array<int,_2,_0,_0> local_1b0;
  pointer local_1a8;
  plain_array<int,_2,_0,_0> local_1a0;
  ScalarPointer local_198;
  ScalarPointer local_190;
  pointer local_188;
  IndexPointer local_180;
  ScalarPointer local_178;
  plain_array<int,_2,_0,_0> local_170;
  plain_array<int,_2,_0,_0> local_168;
  ScalarPointer local_160;
  VectorDynSize *local_158;
  undefined1 local_150 [24];
  plain_array<int,_2,_0,_0> local_138;
  pointer local_130;
  _Alloc_hider local_128;
  DenseStorage<int,_2,_2,_1,_0> local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  ScalarPointer local_108;
  IndexPointer local_100;
  ulong local_f8;
  ulong local_f0;
  DenseStorage<int,_2,_2,_1,_0> local_e8;
  DenseStorage<int,_2,_2,_1,_0> local_e0;
  IndexPointer local_d8;
  DenseStorage<int,_2,_2,_1,_0> local_d0;
  ScalarPointer local_c8;
  IndexPointer local_c0;
  ScalarPointer local_b8;
  IndexPointer local_b0;
  ulong local_a8;
  DenseStorage<int,_2,_2,_1,_0> local_a0;
  IndexPointer local_98;
  DenseStorage<int,_2,_2,_1,_0> local_90;
  ScalarPointer local_88;
  IndexPointer local_80;
  ScalarPointer local_78;
  IndexPointer local_70;
  RhsNested local_68;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_48;
  
  local_188 = (pointer)CONCAT44(local_188._4_4_,
                                (int)CONCAT71(in_register_00000031,computePermutation));
  local_1a0.array = (int  [2])&this->dynamicsConstraintsBias;
  BerdyHelper::getBerdyMatrices
            (this->berdy,&this->dynamicsConstraintsMatrix,(VectorDynSize *)local_1a0.array,
             &this->measurementsMatrix,&this->measurementsBias);
  local_1f8 = this;
  BerdyHelper::getOptions((BerdyOptions *)local_150,this->berdy);
  uVar2 = local_150._0_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_p != &local_118) {
    operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
  }
  local_158 = &this->measurementsBias;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_150 + 0x10));
  if (uVar2 == BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES) {
    local_1a0.array = (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::rows();
    uVar4 = iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::columns();
    uVar3 = iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::numberOfNonZeros();
    pbVar5 = (pointer)iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::outerIndicesBuffer
                                ();
    pcVar6 = (pointer)iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::innerIndicesBuffer
                                ();
    local_120.m_data.array =
         (plain_array<int,_2,_0,_0>)
         iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::valuesBuffer();
    pBVar1 = local_1f8;
    local_150._0_8_ = local_150._0_8_ & 0xffffffffffffff00;
    local_150._16_4_ = local_1a0.array[0];
    local_150._20_4_ = local_1a0.array[1];
    local_138.array = (int  [2])((ulong)uVar3 << 0x20);
    local_118._M_allocated_capacity = 0;
    local_150._8_8_ = uVar4;
    local_130 = pbVar5;
    local_128._M_p = pcVar6;
    Eigen::SparseMatrix<double,0,int>::operator=
              ((SparseMatrix<double,0,int> *)&local_1f8->covarianceDynamicsPriorInverse,
               (SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                *)local_150);
    iDynTree::VectorDynSize::operator=
              (&pBVar1->expectedDynamicsPrior,&pBVar1->priorDynamicsRegularizationExpectedValue);
  }
  else {
    local_1e0.array = (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::rows();
    local_1e8 = iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::columns();
    local_1f0.array =
         (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::numberOfNonZeros();
    pbVar5 = (pointer)iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::outerIndicesBuffer
                                ();
    pcVar6 = (pointer)iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::innerIndicesBuffer
                                ();
    local_120.m_data.array =
         (plain_array<int,_2,_0,_0>)
         iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::valuesBuffer();
    local_150._0_8_ = local_150._0_8_ & 0xffffffffffffff00;
    local_150._8_8_ = local_1e8;
    local_150._16_4_ = local_1e0.array[0];
    local_150._20_4_ = local_1e0.array[1];
    local_138.array = local_1f0.array << 0x20;
    local_118._M_allocated_capacity = 0;
    local_1e0.array = (int  [2])&local_1f8->covarianceDynamicsPriorInverse;
    local_130 = pbVar5;
    local_128._M_p = pcVar6;
    Eigen::SparseMatrix<double,0,int>::operator=
              ((SparseMatrix<double,0,int> *)local_1e0.array,
               (SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                *)local_150);
    local_1e8 = iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::rows();
    local_1f0.array =
         (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::columns();
    lVar8 = iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::numberOfNonZeros();
    local_1a8 = (pointer)iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::
                         outerIndicesBuffer();
    local_1b0.array =
         (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::innerIndicesBuffer();
    local_1b8.array =
         (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::valuesBuffer();
    local_1c8.array = (int  [2])(lVar8 << 0x20);
    local_1c0 = (LhsNested)iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::rows();
    local_1d0.array =
         (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::columns();
    lVar8 = iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::numberOfNonZeros();
    local_1d8.array =
         (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::outerIndicesBuffer();
    local_190 = (ScalarPointer)
                iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::innerIndicesBuffer();
    local_198 = (ScalarPointer)
                iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::valuesBuffer();
    local_168.array = (int  [2])(lVar8 << 0x20);
    local_160 = (ScalarPointer)iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::rows();
    local_170.array =
         (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::columns();
    lVar8 = iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::numberOfNonZeros();
    local_178 = (ScalarPointer)
                iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::outerIndicesBuffer();
    local_180 = (IndexPointer)
                iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::innerIndicesBuffer();
    local_78 = (ScalarPointer)
               iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::valuesBuffer();
    a_00.array = local_1e0.array;
    local_150._0_8_ = local_150._0_8_ & 0xffffffffffffff00;
    local_150._8_4_ = local_1e0.array[0];
    local_150._12_4_ = local_1e0.array[1];
    local_150._16_8_ = local_150._16_8_ & 0xffffffffffffff00;
    local_138.array = local_138.array & 0xffffffffffffff00;
    local_130 = (pointer)((ulong)local_130 & 0xffffffffffffff00);
    local_128._M_p = local_128._M_p & 0xffffffffffffff00;
    local_120.m_data.array = (plain_array<int,_2,_0,_0>)(plain_array<int,_2,_0,_0>)local_1f0.array;
    local_118._M_allocated_capacity = local_1e8;
    local_118._8_4_ = local_1c8.array[0];
    local_118._12_4_ = local_1c8.array[1];
    local_108 = (ScalarPointer)local_1a8;
    local_100 = (IndexPointer)local_1b0.array;
    local_f8._0_4_ = local_1b8.array[0];
    local_f8._4_4_ = local_1b8.array[1];
    local_f0 = 0;
    local_e8.m_data.array =
         (plain_array<int,_2,_0,_0>)((ulong)local_e8.m_data.array & 0xffffffffffffff00);
    local_e0.m_data.array = (plain_array<int,_2,_0,_0>)(plain_array<int,_2,_0,_0>)local_1d0.array;
    local_d8 = (IndexPointer)local_1c0;
    local_d0.m_data.array = (plain_array<int,_2,_0,_0>)(plain_array<int,_2,_0,_0>)local_168.array;
    local_c8 = (ScalarPointer)local_1d8.array;
    local_c0 = (IndexPointer)local_190;
    local_b8 = local_198;
    local_b0 = (IndexPointer)0x0;
    local_a8 = local_a8 & 0xffffffffffffff00;
    local_a0.m_data.array = (plain_array<int,_2,_0,_0>)(plain_array<int,_2,_0,_0>)local_170.array;
    local_98 = (IndexPointer)local_160;
    local_90.m_data.array = (plain_array<int,_2,_0,_0>)(lVar8 << 0x20);
    local_88 = local_178;
    local_80 = local_180;
    local_70 = (IndexPointer)0x0;
    Eigen::SparseMatrix<double,0,int>::operator=
              ((SparseMatrix<double,0,int> *)local_1e0.array,
               (SparseMatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>_>_>
                *)local_150);
    if ((char)local_188 != '\0') {
      Eigen::
      SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
      ::analyzePattern(&(local_1f8->covarianceDynamicsPriorInverseDecomposition).
                        super_SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
                       ,(MatrixType *)a_00.array,true);
    }
    local_1d0.array = (int  [2])&local_1f8->covarianceDynamicsPriorInverseDecomposition;
    Eigen::
    SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
    ::factorize<true>((SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
                       *)local_1d0.array,(MatrixType *)a_00.array);
    local_1e0.array = (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::rows();
    local_1e8 = iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::columns();
    local_1f0.array =
         (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::numberOfNonZeros();
    local_1a8 = (pointer)iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::
                         outerIndicesBuffer();
    local_1b0.array =
         (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::innerIndicesBuffer();
    local_1b8.array =
         (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::valuesBuffer();
    local_1c0 = (LhsNested)iDynTree::VectorDynSize::data();
    pdVar13 = (ScalarPointer)iDynTree::VectorDynSize::size();
    local_1c8.array = (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::rows();
    local_1d8.array =
         (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::columns();
    lVar8 = iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::numberOfNonZeros();
    local_190 = (ScalarPointer)
                iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::outerIndicesBuffer();
    local_198 = (ScalarPointer)
                iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::innerIndicesBuffer();
    local_160 = (ScalarPointer)
                iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::valuesBuffer();
    local_168.array = (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::rows();
    local_170.array =
         (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::columns();
    lVar9 = iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::numberOfNonZeros();
    local_178 = (ScalarPointer)
                iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::outerIndicesBuffer();
    local_180 = (IndexPointer)
                iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::innerIndicesBuffer();
    pdVar7 = (ScalarPointer)
             iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::valuesBuffer();
    uVar15 = iDynTree::VectorDynSize::data();
    local_68._8_8_ = iDynTree::VectorDynSize::size();
    local_150._0_8_ = local_150._0_8_ & 0xffffffffffffff00;
    local_150._8_8_ = local_1e8;
    local_150._16_4_ = local_1e0.array[0];
    local_150._20_4_ = local_1e0.array[1];
    local_138.array = local_1f0.array << 0x20;
    local_130 = local_1a8;
    local_128._M_p = (pointer)local_1b0.array;
    local_120.m_data.array = (plain_array<int,_2,_0,_0>)(plain_array<int,_2,_0,_0>)local_1b8.array;
    local_118._M_allocated_capacity = 0;
    local_118._8_8_ = local_1c0;
    local_f8 = local_f8 & 0xffffffffffffff00;
    local_f0 = local_f0 & 0xffffffffffffff00;
    local_e8.m_data.array =
         (plain_array<int,_2,_0,_0>)((ulong)local_e8.m_data.array & 0xffffffffffffff00);
    local_e0.m_data.array = (plain_array<int,_2,_0,_0>)(plain_array<int,_2,_0,_0>)local_1d8.array;
    local_d8 = (IndexPointer)local_1c8.array;
    local_d0.m_data.array = (plain_array<int,_2,_0,_0>)(lVar8 << 0x20);
    local_c8 = local_190;
    local_c0 = (IndexPointer)local_198;
    local_b8 = local_160;
    local_b0 = (IndexPointer)0x0;
    local_a8 = local_a8 & 0xffffffffffffff00;
    local_a0.m_data.array = (plain_array<int,_2,_0,_0>)(plain_array<int,_2,_0,_0>)local_170.array;
    local_98 = (IndexPointer)local_168.array;
    local_90.m_data.array = (plain_array<int,_2,_0,_0>)(lVar9 << 0x20);
    local_88 = local_178;
    local_80 = local_180;
    local_70 = (IndexPointer)0x0;
    local_108 = pdVar13;
    local_78 = pdVar7;
    local_68._0_8_ = uVar15;
    uVar15 = iDynTree::VectorDynSize::data();
    local_48._8_8_ = iDynTree::VectorDynSize::size();
    local_48._0_8_ = uVar15;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,0>const,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>,2>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,0>const>,Eigen::internal::assign_op<double,double>>
              (&local_48,
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                *)local_150,&local_1f9,(type)0x0);
    pSVar16 = (LhsNested)iDynTree::VectorDynSize::data();
    local_150._8_8_ = iDynTree::VectorDynSize::size();
    local_150._0_8_ = pSVar16;
    uVar15 = iDynTree::VectorDynSize::data();
    local_48._8_8_ = iDynTree::VectorDynSize::size();
    local_48._0_8_ = uVar15;
    Eigen::
    SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,0,int>,1,Eigen::AMDOrdering<int>>>
    ::
    _solve_impl<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
              ((SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,0,int>,1,Eigen::AMDOrdering<int>>>
                *)local_1d0.array,
               (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)local_150,
               (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)&local_48);
  }
  local_1a0.array = (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::rows();
  local_1e0.array = (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::columns();
  lVar8 = iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::numberOfNonZeros();
  local_1e8 = iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::outerIndicesBuffer();
  local_1f0.array =
       (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::innerIndicesBuffer();
  local_1a8 = (pointer)iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::valuesBuffer();
  local_1b0.array = (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::rows();
  local_1b8.array = (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::columns();
  lVar9 = iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::numberOfNonZeros();
  local_1c0 = (LhsNested)
              iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::outerIndicesBuffer();
  local_1c8.array =
       (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::innerIndicesBuffer();
  local_1d0.array =
       (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::valuesBuffer();
  local_1d8.array = (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::rows();
  local_190 = (ScalarPointer)iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::columns();
  lVar10 = iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::numberOfNonZeros();
  local_198 = (ScalarPointer)
              iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::outerIndicesBuffer();
  PVar11.m_storage.m_data.array =
       (DenseStorage<int,_2,_2,_1,_0>)
       iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::innerIndicesBuffer();
  local_88 = (ScalarPointer)
             iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::valuesBuffer();
  pBVar1 = local_1f8;
  local_150._0_8_ = local_150._0_8_ & 0xffffffffffffff00;
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150._16_8_ = local_150._16_8_ & 0xffffffffffffff00;
  local_138.array = local_138.array & 0xffffffffffffff00;
  local_130 = (pointer)local_1e0.array;
  local_128._M_p = (pointer)local_1a0.array;
  local_120.m_data.array = (plain_array<int,_2,_0,_0>)(lVar8 << 0x20);
  local_118._M_allocated_capacity = local_1e8;
  local_118._8_4_ = local_1f0.array[0];
  local_118._12_4_ = local_1f0.array[1];
  local_108 = (ScalarPointer)local_1a8;
  local_100 = (IndexPointer)0x0;
  local_f8 = local_f8 & 0xffffffffffffff00;
  local_f0._0_4_ = local_1b8.array[0];
  local_f0._4_4_ = local_1b8.array[1];
  local_e8.m_data.array = (plain_array<int,_2,_0,_0>)(plain_array<int,_2,_0,_0>)local_1b0.array;
  local_e0.m_data.array = (plain_array<int,_2,_0,_0>)(lVar9 << 0x20);
  local_d8 = (IndexPointer)local_1c0;
  local_d0.m_data.array = (plain_array<int,_2,_0,_0>)(plain_array<int,_2,_0,_0>)local_1c8.array;
  local_c8 = (ScalarPointer)local_1d0.array;
  local_c0 = (IndexPointer)0x0;
  local_b8 = (ScalarPointer)((ulong)local_b8 & 0xffffffffffffff00);
  local_b0 = (IndexPointer)local_190;
  local_a8._0_4_ = local_1d8.array[0];
  local_a8._4_4_ = local_1d8.array[1];
  local_a0.m_data.array = (plain_array<int,_2,_0,_0>)(lVar10 << 0x20);
  local_98 = (IndexPointer)local_198;
  local_80 = (IndexPointer)0x0;
  a = &local_1f8->covarianceDynamicsAPosterioriInverse;
  local_90.m_data.array =
       (plain_array<int,_2,_0,_0>)(plain_array<int,_2,_0,_0>)PVar11.m_storage.m_data.array;
  Eigen::SparseMatrix<double,0,int>::operator=
            ((SparseMatrix<double,0,int> *)a,
             (Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>
              *)local_150);
  local_1c0 = &pBVar1->covarianceDynamicsPriorInverse;
  local_150._0_8_ = local_150._0_8_ & 0xffffffffffffff00;
  local_150._8_8_ = a;
  local_150._16_8_ = local_1c0;
  Eigen::SparseMatrix<double,0,int>::operator=
            ((SparseMatrix<double,0,int> *)a,
             (SparseMatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
              *)local_150);
  if ((char)local_188 != '\0') {
    Eigen::
    SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
    ::analyzePattern(&(pBVar1->covarianceDynamicsAPosterioriInverseDecomposition).
                      super_SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
                     ,a,true);
  }
  local_1b8.array = (int  [2])&pBVar1->covarianceDynamicsAPosterioriInverseDecomposition;
  Eigen::
  SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
  ::factorize<true>((SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
                     *)local_1b8.array,a);
  local_188 = (pointer)iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::rows();
  local_1a0.array = (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::columns();
  lVar8 = iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::numberOfNonZeros();
  local_1e0.array =
       (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::outerIndicesBuffer();
  local_1e8 = iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::innerIndicesBuffer();
  local_1f0.array =
       (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::valuesBuffer();
  local_1a8 = (pointer)iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::rows();
  local_1b0.array = (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::columns();
  lVar9 = iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::numberOfNonZeros();
  local_1c8.array =
       (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::outerIndicesBuffer();
  local_1d0.array =
       (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::innerIndicesBuffer();
  local_1d8.array =
       (int  [2])iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::valuesBuffer();
  piVar12 = (IndexPointer)iDynTree::VectorDynSize::data();
  pdVar13 = (ScalarPointer)iDynTree::VectorDynSize::size();
  IVar14 = iDynTree::VectorDynSize::data();
  local_a0.m_data.array = (plain_array<int,_2,_0,_0>)iDynTree::VectorDynSize::size();
  local_150._0_8_ = local_150._0_8_ & 0xffffffffffffff00;
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150._16_8_ = local_150._16_8_ & 0xffffffffffffff00;
  local_138.array[0] = local_1a0.array[0];
  local_138.array[1] = local_1a0.array[1];
  local_130 = local_188;
  local_128._M_p = (pointer)(lVar8 << 0x20);
  local_120.m_data.array = (plain_array<int,_2,_0,_0>)(plain_array<int,_2,_0,_0>)local_1e0.array;
  local_118._M_allocated_capacity = local_1e8;
  local_118._8_4_ = local_1f0.array[0];
  local_118._12_4_ = local_1f0.array[1];
  local_108 = (ScalarPointer)0x0;
  local_100 = (IndexPointer)((ulong)local_100 & 0xffffffffffffff00);
  local_f8._0_4_ = local_1b0.array[0];
  local_f8._4_4_ = local_1b0.array[1];
  local_f0 = (ulong)local_1a8;
  local_e8.m_data.array = (plain_array<int,_2,_0,_0>)(lVar9 << 0x20);
  local_e0.m_data.array = (plain_array<int,_2,_0,_0>)(plain_array<int,_2,_0,_0>)local_1c8.array;
  local_d8 = (IndexPointer)local_1d0.array;
  local_d0.m_data.array = (plain_array<int,_2,_0,_0>)(plain_array<int,_2,_0,_0>)local_1d8.array;
  local_c8 = (ScalarPointer)0x0;
  local_c0 = piVar12;
  local_b8 = pdVar13;
  local_a8 = IVar14;
  uVar15 = iDynTree::VectorDynSize::data();
  local_48._8_8_ = iDynTree::VectorDynSize::size();
  local_48._0_8_ = uVar15;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>,2>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>,0>,Eigen::internal::assign_op<double,double>>
            (&local_48,
             (Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>
              *)local_150,&local_1f9,(type)0x0);
  IVar14 = iDynTree::VectorDynSize::data();
  local_150._16_8_ = iDynTree::VectorDynSize::size();
  local_150._0_8_ = local_1c0;
  local_150._8_8_ = IVar14;
  uVar15 = iDynTree::VectorDynSize::data();
  local_48._8_8_ = iDynTree::VectorDynSize::size();
  local_48._0_8_ = uVar15;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::SparseMatrix<double,0,int>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,0>,Eigen::internal::add_assign_op<double,double>>
            (&local_48,
             (Product<Eigen::SparseMatrix<double,_0,_int>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              *)local_150,(add_assign_op<double,_double> *)&local_1f9,(type)0x0);
  pSVar16 = (LhsNested)iDynTree::VectorDynSize::data();
  local_150._8_8_ = iDynTree::VectorDynSize::size();
  local_150._0_8_ = pSVar16;
  uVar15 = iDynTree::VectorDynSize::data();
  local_48._8_8_ = iDynTree::VectorDynSize::size();
  local_48._0_8_ = uVar15;
  Eigen::
  SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,0,int>,1,Eigen::AMDOrdering<int>>>
  ::
  _solve_impl<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
            ((SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,0,int>,1,Eigen::AMDOrdering<int>>>
              *)local_1b8.array,
             (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)local_150,
             (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_48);
  return;
}

Assistant:

void BerdySparseMAPSolver::BerdySparseMAPSolverPimpl::computeMAP(bool computePermutation)
    {
        /*
         * Get berdy matrices
         */
        berdy.getBerdyMatrices(dynamicsConstraintsMatrix,
                               dynamicsConstraintsBias,
                               measurementsMatrix,
                               measurementsBias);


        // Compute the maximum a posteriori probability
        // See Latella et al., "Whole-Body Human Inverse Dynamics with
        // Distributed Micro-Accelerometers, Gyros and Force Sensing" in Sensors, 2016

        // Intermediate quantities

        if(berdy.getOptions().berdyVariant!=BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES)
        {
            // Covariance matrix of the prior of the dynamics: var[p(d)], Eq. 10a
            //TODO: find a way to map to iDynTree::SparseMatrix
            covarianceDynamicsPriorInverse
            //    toEigen(m_intermediateQuantities.covarianceDynamicsPriorInverse)
            //Better to assign the "sum" before, and adding the product part later
            = toEigen(priorDynamicsRegularizationCovarianceInverse);

            covarianceDynamicsPriorInverse += toEigen(dynamicsConstraintsMatrix).transpose() * toEigen(priorDynamicsConstraintsCovarianceInverse) * toEigen(dynamicsConstraintsMatrix);

            // decompose m_covarianceDynamicsPriorInverse
            if (computePermutation) {
                covarianceDynamicsPriorInverseDecomposition.analyzePattern(covarianceDynamicsPriorInverse);
            }
            //    m_intermediateQuantities.covarianceDynamicsPriorInverseDecomposition.factorize(toEigen(m_intermediateQuantities.covarianceDynamicsPriorInverse));
            covarianceDynamicsPriorInverseDecomposition.factorize(covarianceDynamicsPriorInverse);

            // Expected value of the prior of the dynamics: E[p(d)], Eq. 10b
            toEigen(expectedDynamicsPriorRHS) = toEigen(priorDynamicsRegularizationCovarianceInverse) * toEigen(priorDynamicsRegularizationExpectedValue) - toEigen(dynamicsConstraintsMatrix).transpose() * toEigen(priorDynamicsConstraintsCovarianceInverse) * toEigen(dynamicsConstraintsBias);

            toEigen(expectedDynamicsPrior) =
            covarianceDynamicsPriorInverseDecomposition.solve(toEigen(expectedDynamicsPriorRHS));
        }
        else
        {
            // Modified eq. 10a and 10b without the dynamics constraints
            covarianceDynamicsPriorInverse = toEigen(priorDynamicsRegularizationCovarianceInverse);
            expectedDynamicsPrior = priorDynamicsRegularizationExpectedValue;
        }
        
        // Final result: covariance matrix of the whole-body dynamics, Eq. 11a
        //TODO: find a way to map to iDynTree::SparseMatrix
        covarianceDynamicsAPosterioriInverse = toEigen(measurementsMatrix).transpose() * toEigen(priorMeasurementsCovarianceInverse) * toEigen(measurementsMatrix);
        covarianceDynamicsAPosterioriInverse += covarianceDynamicsPriorInverse;


        // decompose m_covarianceDynamicsAPosterioriInverse
        if (computePermutation) {
            //        m_intermediateQuantities.covarianceDynamicsAPosterioriInverseDecomposition.analyzePattern(toEigen(m_covarianceDynamicsAPosterioriInverse));
            covarianceDynamicsAPosterioriInverseDecomposition.analyzePattern(covarianceDynamicsAPosterioriInverse);
        }
        //    m_intermediateQuantities.covarianceDynamicsAPosterioriInverseDecomposition.factorize(toEigen(m_covarianceDynamicsAPosterioriInverse));
        covarianceDynamicsAPosterioriInverseDecomposition.factorize(covarianceDynamicsAPosterioriInverse);

        // Final result: expected value of the whole-body dynamics, Eq. 11b
        toEigen(expectedDynamicsAPosterioriRHS) = toEigen(measurementsMatrix).transpose() * toEigen(priorMeasurementsCovarianceInverse) * (toEigen(measurements) - toEigen(measurementsBias));
        toEigen(expectedDynamicsAPosterioriRHS) += covarianceDynamicsPriorInverse * toEigen(expectedDynamicsPrior);
        
        toEigen(expectedDynamicsAPosteriori) =
        covarianceDynamicsAPosterioriInverseDecomposition.solve(toEigen(expectedDynamicsAPosterioriRHS));
    }